

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureSamplerTest::renderResults
          (TextureSamplerTest *this,Surface *textureResult,Surface *samplerResult,int x,int y)

{
  SamplingState *pSVar1;
  RenderContext *pRVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  deBool dVar6;
  undefined4 extraout_var;
  TestError *this_00;
  PixelBufferAccess local_d0;
  PixelBufferAccess local_a8;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  GLfloat local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  GLfloat local_48;
  GLuint local_38;
  GLuint local_34;
  GLuint sampler;
  GLuint texture;
  Functions *gl;
  int y_local;
  int x_local;
  Surface *samplerResult_local;
  Surface *textureResult_local;
  TextureSamplerTest *this_local;
  
  gl._0_4_ = y;
  gl._4_4_ = x;
  _y_local = samplerResult;
  samplerResult_local = textureResult;
  textureResult_local = (Surface *)this;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  _sampler = (Functions *)CONCAT44(extraout_var,iVar4);
  local_34 = createTexture(_sampler,this->m_target);
  local_38 = 0xffffffff;
  (*_sampler->viewport)(gl._4_4_,(int)gl,0x80,0x80);
  GVar5 = (*_sampler->getError)();
  glu::checkError(GVar5,"glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x205);
  (*_sampler->genSamplers)(1,&local_38);
  GVar5 = (*_sampler->getError)();
  glu::checkError(GVar5,"glGenSamplers(1, &sampler)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x208);
  while( true ) {
    dVar6 = ::deGetFalse();
    if ((dVar6 != 0) || (local_38 == 0xffffffff)) break;
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      (*_sampler->bindSampler)(0,local_38);
      GVar5 = (*_sampler->getError)();
      glu::checkError(GVar5,"glBindSampler(0, sampler)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x20c);
      pSVar1 = &this->m_samplerState;
      local_60._0_4_ = pSVar1->minFilter;
      local_60._4_4_ = pSVar1->magFilter;
      local_58._0_4_ = (this->m_samplerState).wrapT;
      local_58._4_4_ = (this->m_samplerState).wrapS;
      local_50._0_4_ = (this->m_samplerState).wrapR;
      local_50._4_4_ = (this->m_samplerState).minLod;
      local_48 = (this->m_samplerState).maxLod;
      setSamplerState(_sampler,*pSVar1,local_38);
      (*_sampler->bindTexture)(this->m_target,local_34);
      GVar5 = (*_sampler->getError)();
      glu::checkError(GVar5,"glBindTexture(m_target, texture)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x213);
      pSVar1 = &this->m_textureState;
      local_80._0_4_ = pSVar1->minFilter;
      local_80._4_4_ = pSVar1->magFilter;
      local_78._0_4_ = (this->m_textureState).wrapT;
      local_78._4_4_ = (this->m_textureState).wrapS;
      local_70._0_4_ = (this->m_textureState).wrapR;
      local_70._4_4_ = (this->m_textureState).minLod;
      local_68 = (this->m_textureState).maxLod;
      setTextureState(_sampler,this->m_target,*pSVar1);
      render(this);
      iVar3 = gl._4_4_;
      iVar4 = (int)gl;
      pRVar2 = this->m_renderCtx;
      tcu::Surface::getAccess(&local_a8,_y_local);
      glu::readPixels(pRVar2,iVar3,iVar4,&local_a8);
      (*_sampler->bindSampler)(0,0);
      GVar5 = (*_sampler->getError)();
      glu::checkError(GVar5,"glBindSampler(0, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x21d);
      render(this);
      iVar3 = gl._4_4_;
      iVar4 = (int)gl;
      pRVar2 = this->m_renderCtx;
      tcu::Surface::getAccess(&local_d0,samplerResult_local);
      glu::readPixels(pRVar2,iVar3,iVar4,&local_d0);
      (*_sampler->deleteSamplers)(1,&local_38);
      GVar5 = (*_sampler->getError)();
      glu::checkError(GVar5,"glDeleteSamplers(1, &sampler)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x223);
      (*_sampler->deleteTextures)(1,&local_34);
      GVar5 = (*_sampler->getError)();
      glu::checkError(GVar5,"glDeleteTextures(1, &texture)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x225);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"sampler != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
             ,0x209);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TextureSamplerTest::renderResults (tcu::Surface& textureResult, tcu::Surface& samplerResult, int x, int y)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	GLuint					texture	= createTexture(gl, m_target);
	GLuint					sampler	= -1;

	gl.viewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)");

	gl.genSamplers(1, &sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenSamplers(1, &sampler)");
	TCU_CHECK(sampler != (GLuint)-1);

	gl.bindSampler(0, sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(0, sampler)");

	// First set sampler state
	setSamplerState(gl, m_samplerState, sampler);

	// Set texture state
	gl.bindTexture(m_target, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture)");

	setTextureState(gl, m_target, m_textureState);

	// Render using sampler
	render();
	glu::readPixels(m_renderCtx, x, y, samplerResult.getAccess());

	// Render without sampler
	gl.bindSampler(0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(0, 0)");

	render();
	glu::readPixels(m_renderCtx, x, y, textureResult.getAccess());

	gl.deleteSamplers(1, &sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteSamplers(1, &sampler)");
	gl.deleteTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures(1, &texture)");
}